

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_convolve_horiz_rs_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn)

{
  int iVar1;
  long lVar2;
  uint8_t *puVar3;
  ulong uVar4;
  int iVar5;
  int x_qn;
  uint uVar6;
  int x;
  ulong uVar7;
  
  puVar3 = src + -3;
  uVar4 = (ulong)(uint)w;
  if (w < 1) {
    uVar4 = 0;
  }
  if (h < 1) {
    h = 0;
  }
  for (iVar1 = 0; iVar1 != h; iVar1 = iVar1 + 1) {
    uVar6 = x0_qn;
    for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      iVar5 = 0;
      for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
        iVar5 = iVar5 + (int)*(short *)((long)x_filters + lVar2 * 2 + (ulong)(uVar6 >> 4 & 0x3f0)) *
                        (uint)puVar3[lVar2 + ((int)uVar6 >> 0xe)];
      }
      iVar5 = iVar5 + 0x40 >> 7;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      dst[uVar7] = (uint8_t)iVar5;
      uVar6 = uVar6 + x_step_qn;
    }
    puVar3 = puVar3 + src_stride;
    dst = dst + dst_stride;
  }
  return;
}

Assistant:

void av1_convolve_horiz_rs_c(const uint8_t *src, int src_stride, uint8_t *dst,
                             int dst_stride, int w, int h,
                             const int16_t *x_filters, int x0_qn,
                             int x_step_qn) {
  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_qn = x0_qn;
    for (int x = 0; x < w; ++x) {
      const uint8_t *const src_x = &src[x_qn >> RS_SCALE_SUBPEL_BITS];
      const int x_filter_idx =
          (x_qn & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
      assert(x_filter_idx <= RS_SUBPEL_MASK);
      const int16_t *const x_filter =
          &x_filters[x_filter_idx * UPSCALE_NORMATIVE_TAPS];
      int sum = 0;
      for (int k = 0; k < UPSCALE_NORMATIVE_TAPS; ++k)
        sum += src_x[k] * x_filter[k];
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
      x_qn += x_step_qn;
    }
    src += src_stride;
    dst += dst_stride;
  }
}